

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.hpp
# Opt level: O1

void __thiscall Search::iterative_deepening(Search *this,position *p,U16 depth,bool silent)

{
  __normal_iterator<Rootmove_*,_std::vector<Rootmove,_std::allocator<Rootmove>_>_> __seed;
  Rootmove *pRVar1;
  short sVar2;
  short sVar3;
  int iVar4;
  Score SVar5;
  long lVar6;
  uint7 in_register_00000009;
  ulong uVar7;
  undefined6 in_register_00000012;
  undefined8 extraout_RDX;
  ulong uVar8;
  ushort uVar9;
  int iVar10;
  position *stack_00;
  uint uVar11;
  Score SVar12;
  bool bVar13;
  long lVar14;
  Score SVar15;
  Score eval;
  Move pv [68];
  node stack [68];
  U16 local_1046;
  Score local_1044;
  uint local_1040;
  Score local_103c;
  position *local_1038;
  uint local_1030;
  uint local_102c;
  int local_1028;
  uint local_1024;
  undefined4 local_1020;
  uint local_101c;
  Rootmoves *local_1018;
  ulong local_1010;
  undefined1 local_1008 [296];
  undefined2 local_ee0;
  node local_ea8 [66];
  
  lVar6 = (ulong)in_register_00000009 << 8;
  local_1020 = (undefined4)CONCAT62(in_register_00000012,depth);
  uVar9 = (ushort)p;
  local_1044 = ninf;
  if (0 < *(int *)(this + 0x2479c)) {
    uVar9 = (ushort)*(int *)(this + 0x2479c);
  }
  lVar14 = 0;
  local_1038 = (position *)this;
  do {
    node::node((node *)(local_1008 + lVar14 + 0xf0));
    lVar14 = lVar14 + 0x38;
  } while (lVar14 != 0xee0);
  lVar14 = 2;
  do {
    *(undefined2 *)(local_1008 + lVar14 + 0x1e) = 0;
    local_1008[lVar14 + 0x20] = 0x11;
    lVar14 = lVar14 + 3;
  } while (lVar14 != 0xce);
  local_ea8[0].pv = (Move *)((long)local_1008 + 0x20);
  uVar11 = (uint)local_1038->thread_id;
  if (local_1038->thread_id < uVar9) {
    local_1030 = (uint)uVar9;
    local_1018 = &local_1038->root_moves;
    local_1028 = (int)CONCAT62((int6)((ulong)local_1018 >> 0x10),10000);
    uVar8 = CONCAT62((int6)((ulong)extraout_RDX >> 0x10),0xd8f0);
    uVar7 = CONCAT62((int6)((ulong)lVar6 >> 0x10),0x41);
    SVar5 = local_1044;
    do {
      if (UCI_SIGNALS.stop != false) break;
      local_1008._24_8_ = ZEXT48(uVar11);
      local_102c = uVar11 + 1;
      local_ea8[0].ply = 0;
      local_ee0 = 0;
      local_1008._240_2_ = 0;
      hashHits = 0;
      local_101c = local_102c & 0xffff;
      bVar13 = false;
      local_1040 = 0;
      while( true ) {
        local_1024 = (uint)uVar8;
        if ((int)local_1008._24_8_ != 0) {
          local_1024 = SVar5 + 0xffffffdf;
          if ((short)local_1024 < -9999) {
            local_1024 = 0xd8f0;
          }
          iVar10 = SVar5 + 0x21;
          iVar4 = 10000;
          if ((short)iVar10 < 10000) {
            iVar4 = iVar10;
          }
          local_1028 = (int)uVar7 + iVar4;
          if (!bVar13) {
            local_1028 = iVar10;
          }
          if (bVar13) {
            bVar13 = false;
          }
          if (9999 < (short)local_1028) {
            local_1028 = 10000;
          }
          if ((local_1040 & 1) != 0) {
            local_1024 = local_1024 - (int)uVar7;
            if ((short)local_1024 < -9999) {
              local_1024 = 0xd8f0;
            }
            local_1040 = 0;
          }
        }
        selDepth = 0;
        SVar12 = (Score)(short)local_1024;
        SVar15 = (Score)(short)local_1028;
        stack_00 = local_1038;
        local_1010 = uVar7;
        SVar5 = search<(Nodetype)0>(local_1038,(short)local_1024,(short)local_1028,(U16)local_101c,
                                    local_ea8);
        __seed._M_current =
             (local_1038->root_moves).super__Vector_base<Rootmove,_std::allocator<Rootmove>_>.
             _M_impl.super__Vector_impl_data._M_start;
        pRVar1 = (local_1038->root_moves).super__Vector_base<Rootmove,_std::allocator<Rootmove>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        local_1044 = SVar5;
        if (__seed._M_current != pRVar1) {
          lVar6 = ((long)pRVar1 - (long)__seed._M_current >> 3) * -0x3333333333333333;
          std::
          _Temporary_buffer<__gnu_cxx::__normal_iterator<Rootmove_*,_std::vector<Rootmove,_std::allocator<Rootmove>_>_>,_Rootmove>
          ::_Temporary_buffer((_Temporary_buffer<__gnu_cxx::__normal_iterator<Rootmove_*,_std::vector<Rootmove,_std::allocator<Rootmove>_>_>,_Rootmove>
                               *)local_1008,__seed,(lVar6 - (lVar6 + 1 >> 0x3f)) + 1 >> 1);
          if ((pointer)local_1008._16_8_ == (pointer)0x0) {
            std::
            __inplace_stable_sort<__gnu_cxx::__normal_iterator<Rootmove*,std::vector<Rootmove,std::allocator<Rootmove>>>,__gnu_cxx::__ops::_Iter_less_iter>
                      (__seed._M_current,pRVar1);
          }
          else {
            std::
            __stable_sort_adaptive<__gnu_cxx::__normal_iterator<Rootmove*,std::vector<Rootmove,std::allocator<Rootmove>>>,Rootmove*,long,__gnu_cxx::__ops::_Iter_less_iter>
                      (__seed._M_current,pRVar1,local_1008._16_8_,local_1008._8_8_);
          }
          stack_00 = (position *)local_1008;
          std::
          _Temporary_buffer<__gnu_cxx::__normal_iterator<Rootmove_*,_std::vector<Rootmove,_std::allocator<Rootmove>_>_>,_Rootmove>
          ::~_Temporary_buffer
                    ((_Temporary_buffer<__gnu_cxx::__normal_iterator<Rootmove_*,_std::vector<Rootmove,_std::allocator<Rootmove>_>_>,_Rootmove>
                      *)stack_00);
        }
        if (UCI_SIGNALS.stop != false) break;
        if ((SVar5 <= SVar12) || (SVar15 <= SVar5)) {
          local_1046 = (U16)local_102c;
          local_103c = SVar15;
          local_1008._0_4_ = SVar12;
          readout_pv((node *)stack_00,local_1018,&local_1044,(Score *)local_1008,&local_103c,
                     &local_1046);
        }
        if ((SVar12 < SVar5) && (SVar5 < SVar15)) break;
        uVar11 = local_1040 & 0xff;
        local_1040 = 1;
        if (SVar12 < SVar5) {
          bVar13 = true;
          local_1040 = uVar11;
        }
        sVar2 = (short)local_1010;
        sVar3 = sVar2 + 3;
        if (-1 < sVar2) {
          sVar3 = sVar2;
        }
        uVar7 = (ulong)(uint)(((int)sVar3 >> 2) + (int)local_1010);
        uVar8 = (ulong)local_1024;
      }
      uVar11 = local_102c;
      if ((local_1038->thread_id == 0) && (UCI_SIGNALS.stop == false)) {
        if ((char)local_1020 == '\0') {
          local_1046 = (U16)local_102c;
          local_103c = SVar15;
          local_1008._0_4_ = SVar12;
          readout_pv((node *)stack_00,local_1018,&local_1044,(Score *)local_1008,&local_103c,
                     &local_1046);
        }
        if (uVar11 == local_1030) {
          UCI_SIGNALS.stop = true;
          break;
        }
      }
      uVar8 = (ulong)local_1024;
      uVar7 = local_1010;
    } while (uVar11 != local_1030);
  }
  lVar6 = 0xec8;
  do {
    History::destroyBmHistory(*(bmHistory **)(local_1008 + lVar6 + 0xf0));
    lVar6 = lVar6 + -0x38;
  } while (lVar6 != -0x18);
  return;
}

Assistant:

void Search::iterative_deepening(position& p, U16 depth, bool silent) {
	int16 alpha = ninf;
	int16 beta = inf;
	int16 delta = 65;
	int16 smallDelta = 33;
	Score eval = ninf;


	if (p.params.fixed_depth > 0) {
		depth = p.params.fixed_depth;
	}

	const unsigned stack_size = 64 + 4;
	node stack[stack_size];
	Move pv[Depth::MAX_PLY + 4];

	(stack + 2)->pv = pv;


	// Main iterative deepening loop
	for (unsigned id = 1 + p.id(); id <= depth; ++id) {

		if (UCI_SIGNALS.stop)
			break;

		(stack+0)->ply = (stack + 1)->ply = (stack + 2)->ply = 0;

		auto failLow = false;
		auto failHigh = false;
		hashHits = 0;

		// 1. aspiration window search
		while (true) {
			if (id >= 2) {
				alpha = std::max(int16(eval - smallDelta), int16(ninf));
				beta = std::min(int16(eval + smallDelta), int16(inf));
				if (failLow) {
					beta = std::min(int16(beta + delta), int16(inf));
					failLow = false;
				}
				if (failHigh) {
					alpha = std::max(int16(alpha - delta), int16(ninf));
					failHigh = false;
				}
			}

			selDepth = 0;
			eval = search<root>(p, alpha, beta, id, stack + 2);

			// bring the best move to the front of the root move array
			std::stable_sort(p.root_moves.begin(), p.root_moves.end());


			if (UCI_SIGNALS.stop)
				break;

			if ((eval <= alpha || eval >= beta))
				readout_pv(stack, p.root_moves, eval, Score(alpha), Score(beta), id);

			if (eval <= alpha) {
				delta += delta / 4;
				failHigh = true;
			}
			else if (eval >= beta) {
				delta += delta / 4;
				failLow = true;
			}
			else break;
		}


		// 2. Print PV to UI
		if (main_thread(p) && !UCI_SIGNALS.stop) {

			if (!silent)
				readout_pv(stack, p.root_moves, eval, Score(alpha), Score(beta), id);

			if (id == depth) {
				UCI_SIGNALS.stop = true;
				break;
			}
		}
	}
}